

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth2-client.c
# Opt level: O2

void ssh2_userauth_filter_queue(ssh2_userauth_state *s)

{
  BinarySink *pBVar1;
  PktInQueue *pPVar2;
  Seat *pSVar3;
  PktIn *pPVar4;
  size_t sVar5;
  StripCtrlChars *sccpub;
  BinarySink *bs;
  ulong uVar6;
  ptrlen pl;
  ptrlen pVar7;
  
  pBVar1 = (s->banner_bs).binarysink_;
  while( true ) {
    pPVar2 = (s->ppl).in_pq;
    pPVar4 = (*pPVar2->after)(&pPVar2->pqb,(PacketQueueNode *)pPVar2,false);
    if ((pPVar4 == (PktIn *)0x0) || (pPVar4->type != 0x35)) break;
    if (s->show_banner == true) {
      pVar7 = BinarySource_get_string(pPVar4->binarysource_);
      uVar6 = pVar7.len;
      sVar5 = bufchain_size(&s->banner);
      if (0x20000 - sVar5 < uVar6) {
        sVar5 = bufchain_size(&s->banner);
        uVar6 = 0x20000 - sVar5;
      }
      if (s->banner_scc_initialised == false) {
        pSVar3 = (s->ppl).seat;
        sccpub = (*pSVar3->vt->stripctrl_new)(pSVar3,pBVar1,SIC_BANNER);
        s->banner_scc = sccpub;
        if (sccpub != (StripCtrlChars *)0x0) {
          stripctrl_enable_line_limiting(sccpub);
        }
        s->banner_scc_initialised = true;
      }
      bs = s->banner_scc->binarysink_;
      if (s->banner_scc->binarysink_ == (BinarySink *)0x0) {
        bs = pBVar1;
      }
      pl.len = uVar6;
      pl.ptr = pVar7.ptr;
      BinarySink_put_datapl(bs,pl);
    }
    pPVar2 = (s->ppl).in_pq;
    (*pPVar2->after)(&pPVar2->pqb,(PacketQueueNode *)pPVar2,true);
  }
  return;
}

Assistant:

static void ssh2_userauth_filter_queue(struct ssh2_userauth_state *s)
{
    PktIn *pktin;
    ptrlen string;

    while ((pktin = pq_peek(s->ppl.in_pq)) != NULL) {
        switch (pktin->type) {
          case SSH2_MSG_USERAUTH_BANNER:
            if (!s->show_banner) {
                pq_pop(s->ppl.in_pq);
                break;
            }

            string = get_string(pktin);
            if (string.len > BANNER_LIMIT - bufchain_size(&s->banner))
                string.len = BANNER_LIMIT - bufchain_size(&s->banner);
            if (!s->banner_scc_initialised) {
                s->banner_scc = seat_stripctrl_new(
                    s->ppl.seat, BinarySink_UPCAST(&s->banner_bs), SIC_BANNER);
                if (s->banner_scc)
                    stripctrl_enable_line_limiting(s->banner_scc);
                s->banner_scc_initialised = true;
            }
            if (s->banner_scc)
                put_datapl(s->banner_scc, string);
            else
                put_datapl(&s->banner_bs, string);
            pq_pop(s->ppl.in_pq);
            break;

          default:
            return;
        }
    }
}